

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_verify.cpp
# Opt level: O0

uint GetLegacySigOpCount(CTransaction *tx)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  long in_RDI;
  long in_FS_OFFSET;
  CTxOut *txout;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range1_1;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  uint nSigOps;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
  *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  reference in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  reference in_stack_ffffffffffffffb8;
  undefined4 local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  while( true ) {
    bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)in_stack_ffffffffffffffa8,
                       (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
         operator*(in_stack_ffffffffffffff98);
    uVar3 = CScript::GetSigOpCount
                      ((CScript *)in_stack_ffffffffffffffb8,
                       SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
    local_34 = uVar3 + local_34;
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++(in_stack_ffffffffffffff98);
  }
  lVar4 = in_RDI + 0x18;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::end
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  while( true ) {
    bVar2 = __gnu_cxx::operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      ((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)in_stack_ffffffffffffffa8,
                       (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffa8 =
         __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
         ::operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      *)in_stack_ffffffffffffff98);
    uVar3 = CScript::GetSigOpCount
                      ((CScript *)in_stack_ffffffffffffffb8,SUB81((ulong)lVar4 >> 0x38,0));
    local_34 = uVar3 + local_34;
    __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
    operator++((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> *)
               in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_34;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int GetLegacySigOpCount(const CTransaction& tx)
{
    unsigned int nSigOps = 0;
    for (const auto& txin : tx.vin)
    {
        nSigOps += txin.scriptSig.GetSigOpCount(false);
    }
    for (const auto& txout : tx.vout)
    {
        nSigOps += txout.scriptPubKey.GetSigOpCount(false);
    }
    return nSigOps;
}